

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

bool __thiscall
cmOrderDirectoriesConstraint::FileMayConflict
          (cmOrderDirectoriesConstraint *this,string *dir,string *name)

{
  bool bVar1;
  char *filename;
  _Self local_70;
  _Self local_68;
  const_iterator fi;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  undefined1 local_48 [8];
  string file;
  string *name_local;
  string *dir_local;
  cmOrderDirectoriesConstraint *this_local;
  
  file.field_2._8_8_ = name;
  std::__cxx11::string::string((string *)local_48,(string *)dir);
  std::__cxx11::string::operator+=((string *)local_48,"/");
  std::__cxx11::string::operator+=((string *)local_48,(string *)file.field_2._8_8_);
  filename = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(filename,true);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::SameFile(&this->FullPath,(string *)local_48);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    fi._M_node = (_Base_ptr)cmGlobalGenerator::GetDirectoryContent(this->GlobalGenerator,dir,false);
    local_68._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)fi._M_node,(key_type *)file.field_2._8_8_);
    local_70._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(fi._M_node);
    this_local._7_1_ = std::operator!=(&local_68,&local_70);
  }
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmOrderDirectoriesConstraint::FileMayConflict(std::string const& dir,
                                                   std::string const& name)
{
  // Check if the file exists on disk.
  std::string file = dir;
  file += "/";
  file += name;
  if(cmSystemTools::FileExists(file.c_str(), true))
    {
    // The file conflicts only if it is not the same as the original
    // file due to a symlink or hardlink.
    return !cmSystemTools::SameFile(this->FullPath, file);
    }

  // Check if the file will be built by cmake.
  std::set<std::string> const& files =
    (this->GlobalGenerator->GetDirectoryContent(dir, false));
  std::set<std::string>::const_iterator fi = files.find(name);
  return fi != files.end();
}